

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibusplatforminputcontext.cpp
# Opt level: O2

void __thiscall QIBusPlatformInputContext::cursorRectChanged(QIBusPlatformInputContext *this)

{
  char cVar1;
  QPoint *pQVar2;
  long lVar3;
  ulong uVar4;
  QDebug *pQVar5;
  QPoint QVar6;
  QSize QVar7;
  Representation RVar8;
  QDBusPendingReplyBase *this_00;
  Representation RVar9;
  int iVar10;
  Representation RVar11;
  long in_FS_OFFSET;
  double dVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  QRect QVar16;
  QLatin1String QVar17;
  int local_a8;
  QDBusPendingReplyBase local_a0;
  Stream *local_98;
  undefined1 local_90 [8];
  QDBusPendingReplyBase local_88;
  QDebug local_80;
  Stream *local_78;
  undefined1 local_70 [8];
  undefined8 local_68;
  int iStack_60;
  int iStack_5c;
  undefined1 local_58 [4];
  Representation RStack_54;
  undefined1 auStack_50 [12];
  undefined4 local_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(char *)(*(long *)(this + 0x18) + 0x2a) == '\x01') {
    QGuiApplication::inputMethod();
    QInputMethod::cursorRectangle();
    QVar16 = QRectF::toRect((QRectF *)local_58);
    RVar9 = QVar16.x1.m_i;
    RVar8 = QVar16.x2.m_i;
    RVar11 = QVar16.y1.m_i;
    if (((RVar11.m_i <= QVar16.y2.m_i.m_i && RVar9.m_i <= RVar8.m_i) &&
        (pQVar2 = (QPoint *)QGuiApplication::focusWindow(), pQVar2 != (QPoint *)0x0)) &&
       (lVar3 = QWindow::screen(), lVar3 != 0)) {
      QGuiApplication::platformName();
      QVar17.m_data = (char *)0x7;
      QVar17.m_size = (qsizetype)local_58;
      cVar1 = QString::startsWith(QVar17,0x11e8c5);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
      if (cVar1 == '\0') {
        QWindow::screen();
        uVar4 = QScreen::geometry();
        local_58 = (undefined1  [4])RVar9.m_i;
        RStack_54.m_i = RVar11.m_i;
        lVar3 = QWindow::mapToGlobal(pQVar2);
        dVar12 = (double)QWindow::devicePixelRatio();
        local_58 = (undefined1  [4])((int)lVar3 - (int)uVar4);
        RStack_54.m_i = (int)(lVar3 - (uVar4 & 0xffffffff00000000) >> 0x20);
        QVar6 = operator*((QPoint *)local_58,dVar12);
        iVar10 = QVar6.xp.m_i.m_i + (int)uVar4;
        local_a8 = (int)(uVar4 >> 0x20);
        local_a8 = QVar6.yp.m_i.m_i + local_a8;
        local_58 = (undefined1  [4])((RVar8.m_i - RVar9.m_i) + 1);
        RStack_54.m_i = (QVar16.y2.m_i.m_i - RVar11.m_i) + 1;
        QVar7 = operator*((QSize *)local_58,dVar12);
        iVar14 = QVar7.wd.m_i.m_i + iVar10 + -1;
        local_68 = CONCAT44(local_a8,iVar10);
        iVar15 = QVar7.ht.m_i.m_i + local_a8 + -1;
        iStack_60 = iVar14;
        iStack_5c = iVar15;
        lcQpaInputMethods();
        if (((byte)lcQpaInputMethods::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
            != 0) {
          local_58 = (undefined1  [4])0x2;
          RStack_54.m_i = 0;
          auStack_50 = SUB1612((undefined1  [16])0x0,4);
          local_44 = 0;
          local_40 = lcQpaInputMethods::category.name;
          QMessageLogger::debug();
          pQVar5 = QDebug::operator<<(&local_80,"microFocus");
          local_98 = pQVar5->stream;
          *(int *)(local_98 + 0x28) = *(int *)(local_98 + 0x28) + 1;
          ::operator<<((Stream *)local_90,(QRect *)&local_98);
          QDebug::~QDebug((QDebug *)local_90);
          QDebug::~QDebug((QDebug *)&local_98);
          QDebug::~QDebug(&local_80);
          iVar14 = iStack_60;
          iVar15 = iStack_5c;
          iVar10 = (int)local_68;
          local_a8 = local_68._4_4_;
        }
        this_00 = &local_a0;
        QIBusInputContextProxy::SetCursorLocation
                  ((QDBusPendingReply<> *)this_00,
                   *(QIBusInputContextProxy **)(*(long *)(this + 0x18) + 0x10),iVar10,local_a8,
                   (iVar14 - iVar10) + 1,(iVar15 - local_a8) + 1);
      }
      else {
        uVar4 = QWindow::frameMargins();
        iVar10 = (int)uVar4 + RVar9.m_i;
        dVar12 = (double)QWindow::devicePixelRatio();
        iVar13 = (int)((uVar4 & 0xffffffff00000000) + QVar16._0_8_ >> 0x20);
        iVar14 = (int)((double)iVar10 * dVar12);
        iVar15 = (int)((double)iVar13 * dVar12);
        iVar10 = iVar14 + -1 + (int)((double)(((RVar8.m_i + (int)uVar4) - iVar10) + 1) * dVar12);
        iVar13 = iVar15 + -1 +
                 (int)((double)(((int)((QVar16._8_8_ & 0xffffffff00000000) + uVar4 >> 0x20) - iVar13
                                ) + 1) * dVar12);
        local_68 = CONCAT44(iVar15,iVar14);
        iStack_60 = iVar10;
        iStack_5c = iVar13;
        lcQpaInputMethods();
        if (((byte)lcQpaInputMethods::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
            != 0) {
          local_58 = (undefined1  [4])0x2;
          RStack_54.m_i = 0;
          auStack_50 = SUB1612((undefined1  [16])0x0,4);
          local_44 = 0;
          local_40 = lcQpaInputMethods::category.name;
          QMessageLogger::debug();
          pQVar5 = QDebug::operator<<(&local_80,"microFocus");
          local_78 = pQVar5->stream;
          *(int *)(local_78 + 0x28) = *(int *)(local_78 + 0x28) + 1;
          ::operator<<((Stream *)local_70,(QRect *)&local_78);
          QDebug::~QDebug((QDebug *)local_70);
          QDebug::~QDebug((QDebug *)&local_78);
          QDebug::~QDebug(&local_80);
          iVar14 = (int)local_68;
          iVar15 = local_68._4_4_;
          iVar10 = iStack_60;
          iVar13 = iStack_5c;
        }
        this_00 = &local_88;
        QIBusInputContextProxy::SetCursorLocationRelative
                  ((QDBusPendingReply<> *)this_00,
                   *(QIBusInputContextProxy **)(*(long *)(this + 0x18) + 0x10),iVar14,iVar15,
                   (iVar10 - iVar14) + 1,(iVar13 - iVar15) + 1);
      }
      QDBusPendingReplyBase::~QDBusPendingReplyBase(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIBusPlatformInputContext::cursorRectChanged()
{
    if (!d->busConnected)
        return;

    QRect r = qApp->inputMethod()->cursorRectangle().toRect();
    if (!r.isValid())
        return;

    QWindow *inputWindow = qApp->focusWindow();
    if (!inputWindow)
        return;
    if (!inputWindow->screen())
        return;

    if (QGuiApplication::platformName().startsWith("wayland"_L1)) {
        auto margins = inputWindow->frameMargins();
        r.translate(margins.left(), margins.top());
        qreal scale = inputWindow->devicePixelRatio();
        QRect newRect = QRect(r.x() * scale, r.y() * scale, r.width() * scale, r.height() * scale);
        qCDebug(lcQpaInputMethods) << "microFocus" << newRect;
        d->context->SetCursorLocationRelative(newRect.x(), newRect.y(),
                                              newRect.width(), newRect.height());
        return;
    }

    // x11/xcb
    auto screenGeometry = inputWindow->screen()->geometry();
    auto point = inputWindow->mapToGlobal(r.topLeft());
    qreal scale = inputWindow->devicePixelRatio();
    auto native = (point - screenGeometry.topLeft()) * scale + screenGeometry.topLeft();
    QRect newRect(native, r.size() * scale);
    qCDebug(lcQpaInputMethods) << "microFocus" << newRect;
    d->context->SetCursorLocation(newRect.x(), newRect.y(),
                                  newRect.width(), newRect.height());
}